

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3SelectLeaf(Fts3Table *p,char *zTerm,int nTerm,char *zNode,int nNode,sqlite3_int64 *piLeaf,
                  sqlite3_int64 *piLeaf2)

{
  Fts3Table *p_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  void *__s2;
  sqlite3_int64 *psVar6;
  long *plVar7;
  uint uVar8;
  long lVar9;
  long *plVar10;
  undefined4 in_register_00000084;
  int *pnLoad;
  char *pcVar11;
  int iVar12;
  void *pOld;
  char *p_01;
  sqlite3_int64 *piLeaf_00;
  bool bVar13;
  int nSuffix;
  sqlite3_int64 iChild;
  int iHeight;
  uint local_84;
  char *local_80;
  int local_74;
  ulong local_70;
  int local_68;
  int local_64;
  long *local_60;
  char *local_58;
  Fts3Table *local_50;
  long *local_48;
  long *local_40;
  char *local_38;
  
  pnLoad = (int *)CONCAT44(in_register_00000084,nNode);
  iVar2 = (int)*zNode;
  local_58 = zTerm;
  local_50 = p;
  local_48 = piLeaf;
  if (*zNode < '\0') {
    sqlite3Fts3GetVarint32(zNode,&local_64);
    iVar2 = local_64;
  }
  local_64 = iVar2;
  pcVar11 = zNode + nNode;
  iVar2 = sqlite3Fts3GetVarint(zNode,(sqlite_int64 *)&local_80);
  iVar3 = sqlite3Fts3GetVarint(zNode + iVar2,(sqlite_int64 *)&local_80);
  p_01 = zNode + iVar2 + iVar3;
  iVar2 = 0x10b;
  if (p_01 <= pcVar11) {
    local_70 = 0;
    pOld = (void *)0x0;
    uVar8 = 0;
    bVar1 = false;
    plVar7 = piLeaf2;
    plVar10 = local_48;
    local_68 = nTerm;
    local_38 = pcVar11;
    do {
      if ((pcVar11 <= p_01) || (plVar10 == (long *)0x0 && plVar7 == (long *)0x0)) {
        if (plVar10 != (long *)0x0) {
          *plVar10 = (long)local_80;
        }
        if (plVar7 != (long *)0x0) {
          *plVar7 = (long)local_80;
        }
        break;
      }
      local_74 = 0;
      if (bVar1) {
        if (*p_01 < '\0') {
          uVar4 = sqlite3Fts3GetVarint32(p_01,&local_74);
          uVar5 = (ulong)uVar4;
        }
        else {
          uVar5 = 1;
          local_74 = (int)*p_01;
        }
        p_01 = p_01 + uVar5;
      }
      if (*p_01 < '\0') {
        uVar4 = sqlite3Fts3GetVarint32(p_01,(int *)&local_84);
        uVar5 = (ulong)uVar4;
      }
      else {
        uVar5 = 1;
        local_84 = (int)*p_01;
      }
      p_01 = p_01 + uVar5;
      bVar13 = true;
      if (((local_74 < 0) || ((int)local_84 < 0)) || (pcVar11 < p_01 + local_84)) {
        local_70 = 0x10b;
      }
      else {
        __s2 = pOld;
        local_60 = plVar7;
        local_40 = plVar10;
        if ((int)uVar8 < (int)(local_74 + local_84)) {
          uVar8 = (local_74 + local_84) * 2;
          iVar2 = sqlite3_initialize();
          uVar5 = local_70;
          if (iVar2 == 0) {
            __s2 = sqlite3Realloc(pOld,(ulong)uVar8);
          }
          else {
            __s2 = (void *)0x0;
          }
          bVar13 = __s2 == (void *)0x0;
          local_70 = uVar5 & 0xffffffff;
          if (bVar13) {
            local_70 = 7;
            plVar7 = local_60;
            plVar10 = local_40;
            goto LAB_00177d2a;
          }
        }
        memcpy((void *)((long)local_74 + (long)__s2),p_01,(long)(int)local_84);
        iVar2 = local_68;
        lVar9 = (long)(int)local_84;
        iVar12 = local_74 + local_84;
        iVar3 = local_68;
        if (iVar12 < local_68) {
          iVar3 = iVar12;
        }
        iVar3 = memcmp(local_58,__s2,(long)iVar3);
        if (local_40 == (long *)0x0) {
LAB_00177cfe:
          plVar10 = (long *)0x0;
        }
        else if ((iVar3 < 0) || (plVar10 = local_40, iVar3 == 0 && iVar2 < iVar12)) {
          *local_40 = (long)local_80;
          goto LAB_00177cfe;
        }
        plVar7 = local_60;
        if ((local_60 != (long *)0x0) && (iVar3 < 0)) {
          *local_60 = (long)local_80;
          plVar7 = (long *)0x0;
        }
        p_01 = p_01 + lVar9;
        local_80 = local_80 + 1;
        bVar13 = false;
        pcVar11 = local_38;
        pOld = __s2;
      }
LAB_00177d2a:
      bVar1 = true;
    } while (!bVar13);
    sqlite3_free(pOld);
    iVar2 = (int)local_70;
    nTerm = local_68;
  }
  plVar7 = local_48;
  p_00 = local_50;
  if ((iVar2 == 0) && (1 < local_64)) {
    local_80 = (char *)0x0;
    local_84 = 0;
    iVar2 = 0;
    piLeaf_00 = local_48;
    if ((piLeaf2 != (sqlite3_int64 *)0x0 && local_48 != (sqlite3_int64 *)0x0) &&
       (*local_48 != *piLeaf2)) {
      iVar2 = sqlite3Fts3ReadBlock(local_50,*local_48,&local_80,(int *)&local_84,pnLoad);
      if (iVar2 == 0) {
        pnLoad = (int *)(ulong)local_84;
        iVar2 = fts3SelectLeaf(p_00,local_58,nTerm,local_80,local_84,plVar7,(sqlite3_int64 *)0x0);
      }
      sqlite3_free(local_80);
      piLeaf_00 = (sqlite3_int64 *)0x0;
    }
    local_80 = (char *)0x0;
    if (iVar2 == 0) {
      psVar6 = piLeaf_00;
      if (piLeaf_00 == (sqlite3_int64 *)0x0) {
        psVar6 = piLeaf2;
      }
      iVar2 = sqlite3Fts3ReadBlock(p_00,*psVar6,&local_80,(int *)&local_84,pnLoad);
    }
    if (iVar2 == 0) {
      iVar2 = fts3SelectLeaf(p_00,local_58,nTerm,local_80,local_84,piLeaf_00,piLeaf2);
    }
    sqlite3_free(local_80);
  }
  return iVar2;
}

Assistant:

static int fts3SelectLeaf(
  Fts3Table *p,                   /* Virtual table handle */
  const char *zTerm,              /* Term to select leaves for */
  int nTerm,                      /* Size of term zTerm in bytes */
  const char *zNode,              /* Buffer containing segment interior node */
  int nNode,                      /* Size of buffer at zNode */
  sqlite3_int64 *piLeaf,          /* Selected leaf node */
  sqlite3_int64 *piLeaf2          /* Selected leaf node */
){
  int rc = SQLITE_OK;             /* Return code */
  int iHeight;                    /* Height of this node in tree */

  assert( piLeaf || piLeaf2 );

  fts3GetVarint32(zNode, &iHeight);
  rc = fts3ScanInteriorNode(zTerm, nTerm, zNode, nNode, piLeaf, piLeaf2);
  assert( !piLeaf2 || !piLeaf || rc!=SQLITE_OK || (*piLeaf<=*piLeaf2) );

  if( rc==SQLITE_OK && iHeight>1 ){
    char *zBlob = 0;              /* Blob read from %_segments table */
    int nBlob = 0;                /* Size of zBlob in bytes */

    if( piLeaf && piLeaf2 && (*piLeaf!=*piLeaf2) ){
      rc = sqlite3Fts3ReadBlock(p, *piLeaf, &zBlob, &nBlob, 0);
      if( rc==SQLITE_OK ){
        rc = fts3SelectLeaf(p, zTerm, nTerm, zBlob, nBlob, piLeaf, 0);
      }
      sqlite3_free(zBlob);
      piLeaf = 0;
      zBlob = 0;
    }

    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3ReadBlock(p, piLeaf?*piLeaf:*piLeaf2, &zBlob, &nBlob, 0);
    }
    if( rc==SQLITE_OK ){
      rc = fts3SelectLeaf(p, zTerm, nTerm, zBlob, nBlob, piLeaf, piLeaf2);
    }
    sqlite3_free(zBlob);
  }

  return rc;
}